

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

MCU * readMCU(MCU *__return_storage_ptr__,FILE *f)

{
  uchar number;
  bool bVar1;
  byte bVar5;
  int j;
  int iVar2;
  int iVar3;
  acCode aVar4;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  ulong local_58;
  
  memset(__return_storage_ptr__,0,0x2000);
  uVar9 = 1;
  do {
    if (subVector[uVar9].height != '\0') {
      number = (uchar)(uVar9 >> 1);
      local_58 = 0;
      do {
        if (subVector[uVar9].width != '\0') {
          uVar8 = 0;
          do {
            iVar2 = readDC(f,number);
            iVar3 = readMCU::dc[uVar9];
            readMCU::dc[uVar9] = iVar2 + iVar3;
            __return_storage_ptr__->mcu[uVar9][local_58][uVar8][0][0] = (double)(iVar2 + iVar3);
            uVar7 = 1;
            do {
              if (0x3f < uVar7) break;
              aVar4 = readAC(f,number);
              bVar5 = aVar4.zeros;
              uVar6 = (uint)bVar5;
              if (bVar5 == 0x10 && aVar4.len == '\0') {
                iVar3 = 0;
                do {
                  __return_storage_ptr__->mcu[uVar9][local_58][uVar8][uVar7 + iVar3 >> 3]
                  [uVar7 + iVar3 & 7] = 0.0;
                  iVar3 = iVar3 + 1;
                } while (iVar3 != 0x10);
                uVar7 = uVar7 + 0x10;
LAB_00103fe2:
                bVar1 = true;
              }
              else {
                if (aVar4.len != '\0') {
                  if (bVar5 != 0) {
                    do {
                      __return_storage_ptr__->mcu[uVar9][local_58][uVar8][uVar7 >> 3][uVar7 & 7] =
                           0.0;
                      uVar7 = uVar7 + 1;
                      uVar6 = uVar6 - 1;
                    } while (uVar6 != 0);
                  }
                  __return_storage_ptr__->mcu[uVar9][local_58][uVar8][uVar7 >> 3][uVar7 & 7] =
                       (double)aVar4.value;
                  uVar7 = uVar7 + 1;
                  goto LAB_00103fe2;
                }
                bVar1 = false;
              }
            } while (bVar1);
            if (uVar7 < 0x40) {
              do {
                __return_storage_ptr__->mcu[uVar9][local_58][uVar8][uVar7 >> 3][uVar7 & 7] = 0.0;
                uVar7 = uVar7 + 1;
              } while (uVar7 != 0x40);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < subVector[uVar9].width);
        }
        local_58 = local_58 + 1;
      } while (local_58 < subVector[uVar9].height);
    }
    uVar9 = uVar9 + 1;
    if (uVar9 == 4) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

MCU readMCU(FILE *f) {
    static int dc[4] = {0, 0, 0, 0};
    auto mcu = MCU();
    for (int i = 1; i <= 3; i++) {
        for (int h = 0; h < subVector[i].height; h++) {
            for (int w = 0; w < subVector[i].width; w++) {
                dc[i] = readDC(f, i/2) + dc[i];
                mcu.mcu[i][h][w][0][0] = dc[i];
                unsigned int count = 1;
                while (count < 64) {
                    acCode ac = readAC(f, i/2);
                    if (ac.len == 0 && ac.zeros == 16) {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                    } else if (ac.len == 0) {
                        break;
                    } else {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                        mcu.mcu[i][h][w][count/8][count%8] = ac.value;
                        count++;
                    }
                }
                while (count < 64) {
                    mcu.mcu[i][h][w][count/8][count%8] = 0;
                    count++;
                }
            }
        }
    }
    return mcu;
}